

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

Ref<embree::SceneGraph::PerspectiveCameraNode> __thiscall
embree::TutorialScene::getCamera(TutorialScene *this,string *name)

{
  __type_conflict _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  PerspectiveCameraNode *in_RDI;
  size_t i;
  char *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  PerspectiveCameraNode *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  string local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  reference local_18;
  reference local_10;
  
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  __rhs = in_RDI;
  while( true ) {
    __lhs = local_38;
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
             ::size((vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                     *)in_RSI);
    if (pbVar2 <= __lhs) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      std::operator+(__lhs,in_stack_ffffffffffffff50);
      std::runtime_error::runtime_error(this_00,local_58);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_18 = std::
               vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
               ::operator[]((vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                             *)in_RSI,(size_type)local_38);
    _Var1 = std::operator==(in_RSI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)__rhs);
    if (_Var1) break;
    local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &local_38->field_0x1;
  }
  local_10 = std::
             vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
             ::operator[]((vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                           *)in_RSI,(size_type)local_38);
  (in_RDI->super_Node).super_RefCount._vptr_RefCount = (_func_int **)local_10->ptr;
  if ((in_RDI->super_Node).super_RefCount._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_Node).super_RefCount._vptr_RefCount + 0x10))();
  }
  return (Ref<embree::SceneGraph::PerspectiveCameraNode>)__rhs;
}

Assistant:

Ref<SceneGraph::PerspectiveCameraNode> TutorialScene::getCamera(const std::string& name)
  {
    for (size_t i=0; i<cameras.size(); i++)
      if (cameras[i]->name == name) return cameras[i];
    
    THROW_RUNTIME_ERROR("camera \"" + name +"\" not found");
  }